

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void NGA_Set_ghosts(int g_a,int *width)

{
  Integer IVar1;
  long in_RSI;
  int in_EDI;
  int i;
  Integer _ga_work [7];
  Integer ndim;
  Integer *ptr;
  Integer aa;
  int local_6c;
  Integer *in_stack_ffffffffffffff98;
  Integer in_stack_ffffffffffffffa0;
  
  IVar1 = pnga_get_dimension((long)in_EDI);
  if (in_RSI != 0) {
    for (local_6c = 0; local_6c < IVar1; local_6c = local_6c + 1) {
      *(long *)(&stack0xffffffffffffff98 + ((IVar1 - local_6c) + -1) * 8) =
           (long)*(int *)(in_RSI + (long)local_6c * 4);
    }
  }
  pnga_set_ghosts(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  return;
}

Assistant:

void NGA_Set_ghosts(int g_a, int width[])
{
    Integer aa, *ptr, ndim;
    Integer _ga_work[MAXDIM];
    aa = (Integer)g_a;
    ndim = wnga_get_dimension(aa);
    if(!width)ptr=(Integer*)0;  
    else {
      COPYC2F(width,_ga_work, ndim);
      ptr = _ga_work;
    }
    wnga_set_ghosts(aa, ptr);
}